

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.cpp
# Opt level: O3

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int> *
Decoder::decode(pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                *__return_storage_ptr__,string *msg)

{
  size_type sVar1;
  char *pcVar2;
  undefined1 *resource;
  size_type sVar3;
  string result;
  undefined7 local_48;
  undefined1 uStack_41;
  undefined7 local_40;
  undefined1 uStack_39;
  undefined1 local_38 [16];
  
  sVar1 = msg->_M_string_length;
  resource = (undefined1 *)Resource_Reserve(sVar1 + 1);
  if (resource == (undefined1 *)0x0) {
    (__return_storage_ptr__->first)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->first).field_2;
    (__return_storage_ptr__->first).field_2._M_local_buf[0] = '\0';
    *(ulong *)((long)&(__return_storage_ptr__->first).field_2 + 1) = CONCAT17(uStack_41,local_48);
    *(ulong *)((long)&(__return_storage_ptr__->first).field_2 + 8) = CONCAT71(local_40,uStack_41);
    (__return_storage_ptr__->first)._M_string_length = 0;
    __return_storage_ptr__->second = -1;
  }
  else if ((sVar1 + 1 == 0) || (pcVar2 = (msg->_M_dataplus)._M_p, *pcVar2 != '#')) {
    Resource_Free(resource);
    (__return_storage_ptr__->first)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->first).field_2;
    (__return_storage_ptr__->first).field_2._M_local_buf[0] = '\0';
    *(ulong *)((long)&(__return_storage_ptr__->first).field_2 + 1) = CONCAT17(uStack_41,local_48);
    *(ulong *)((long)&(__return_storage_ptr__->first).field_2 + 8) = CONCAT71(local_40,uStack_41);
    (__return_storage_ptr__->first)._M_string_length = 0;
    __return_storage_ptr__->second = 1;
  }
  else {
    *resource = 0x21;
    if (sVar1 != 0) {
      sVar3 = 0;
      do {
        resource[sVar3 + 1] = pcVar2[sVar3 + 1] + '\x01';
        sVar3 = sVar3 + 1;
      } while (sVar1 != sVar3);
    }
    local_48 = SUB87(local_38,0);
    uStack_41 = (undefined1)((ulong)local_38 >> 0x38);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,resource,resource + sVar1);
    Resource_Free(resource);
    (__return_storage_ptr__->first)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->first).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,CONCAT17(uStack_41,local_48),
               CONCAT17(uStack_39,local_40) + CONCAT17(uStack_41,local_48));
    __return_storage_ptr__->second = 0;
    if ((undefined1 *)CONCAT17(uStack_41,local_48) != local_38) {
      operator_delete((undefined1 *)CONCAT17(uStack_41,local_48));
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<std::string, int> decode(const std::string& msg)
	{
		size_t size = msg.size() + 1;
		union {
			void* void_ptr;
			char* char_ptr;
		} p = { Resource_Reserve(size) };

		if (!p.void_ptr)
			return std::make_pair(std::string(), -1);

		int errorCode = 0;

		if ((errorCode = details::decode(msg.data(), size, p.char_ptr)) != 0)
		{
			Resource_Free(p.void_ptr);
			return std::make_pair(std::string(), errorCode);
		}

		std::string result(p.char_ptr, size-1);

		Resource_Free(p.void_ptr);

		return { result, errorCode };
	}